

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

UnicodeString *
icu_63::number::impl::PatternStringUtils::propertiesToPatternString
          (UnicodeString *__return_storage_ptr__,DecimalFormatProperties *properties,
          UErrorCode *status)

{
  double input;
  bool bVar1;
  bool bVar2;
  short sVar3;
  NullableValue<UNumberFormatPadPosition> NVar4;
  ulong uVar5;
  digits_t dVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int iVar15;
  UnicodeString *pUVar16;
  int iVar17;
  undefined4 uVar18;
  uint uVar19;
  undefined8 uVar20;
  int iVar21;
  int y;
  int iVar22;
  int iVar23;
  DecimalQuantity incrementQuantity;
  UnicodeString digitsString;
  UnicodeString str;
  UnicodeString npp;
  UnicodeString nsp;
  UnicodeString paddingString;
  UnicodeString psp;
  UnicodeString ppp;
  UnicodeString ns;
  UnicodeString np;
  UnicodeString ps;
  UnicodeString pp;
  int local_494;
  undefined1 local_460 [80];
  ulong local_410;
  int32_t local_408;
  int32_t local_404;
  UnicodeString local_400;
  UErrorCode *local_3c0;
  NullableValue<UNumberFormatPadPosition> local_3b8;
  UnicodeString local_3b0;
  UnicodeString local_370;
  UnicodeString local_330;
  UnicodeString local_2f0;
  UnicodeString local_2b0;
  UnicodeString local_270;
  UnicodeString local_230;
  UnicodeString local_1f0 [5];
  UnicodeString local_b0;
  UnicodeString local_70;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b2258;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  local_3c0 = status;
  local_494 = uprv_min_63(properties->secondaryGroupingSize,100);
  iVar7 = uprv_min_63(properties->groupingSize,100);
  iVar8 = uprv_min_63(properties->formatWidth,100);
  NVar4 = properties->padPosition;
  UnicodeString::UnicodeString(&local_2f0,&properties->padString);
  iVar9 = uprv_min_63(properties->minimumIntegerDigits,100);
  iVar9 = uprv_max_63(iVar9,0);
  local_404 = uprv_min_63(properties->maximumIntegerDigits,100);
  iVar10 = uprv_min_63(properties->minimumFractionDigits,100);
  iVar10 = uprv_max_63(iVar10,0);
  local_408 = uprv_min_63(properties->maximumFractionDigits,100);
  iVar11 = uprv_min_63(properties->minimumSignificantDigits,100);
  local_3b8 = NVar4;
  iVar12 = uprv_min_63(properties->maximumSignificantDigits,100);
  bVar1 = properties->decimalSeparatorAlwaysShown;
  iVar13 = uprv_min_63(properties->minimumExponentDigits,100);
  bVar2 = properties->exponentSignAlwaysShown;
  UnicodeString::UnicodeString(&local_70,&properties->positivePrefix);
  UnicodeString::UnicodeString(&local_270,&properties->positivePrefixPattern);
  UnicodeString::UnicodeString(&local_b0,&properties->positiveSuffix);
  UnicodeString::UnicodeString(&local_2b0,&properties->positiveSuffixPattern);
  UnicodeString::UnicodeString(local_1f0,&properties->negativePrefix);
  UnicodeString::UnicodeString(&local_370,&properties->negativePrefixPattern);
  UnicodeString::UnicodeString(&local_230,&properties->negativeSuffix);
  UnicodeString::UnicodeString(&local_330,&properties->negativeSuffixPattern);
  if ((local_270.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < local_270.fUnion.fStackFields.fLengthAndFlags) {
      local_270.fUnion.fFields.fLength = (int)local_270.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(__return_storage_ptr__,&local_270,0,local_270.fUnion.fFields.fLength);
  }
  AffixUtils::escape((UnicodeString *)local_460,&local_70);
  iVar17 = local_460._12_4_;
  if (-1 < (short)local_460._8_2_) {
    iVar17 = (int)(short)local_460._8_2_ >> 5;
  }
  UnicodeString::doAppend(__return_storage_ptr__,(UnicodeString *)local_460,0,iVar17);
  UnicodeString::~UnicodeString((UnicodeString *)local_460);
  sVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    uVar19 = (__return_storage_ptr__->fUnion).fFields.fLength;
  }
  else {
    uVar19 = (int)sVar3 >> 5;
  }
  local_410 = (ulong)uVar19;
  iVar14 = uprv_min_63(100,-1);
  if ((local_494 == iVar14) ||
     (iVar14 = uprv_min_63(100,-1), iVar17 = iVar7, iVar15 = local_494,
     local_494 == iVar7 || iVar7 == iVar14)) {
    iVar14 = uprv_min_63(100,-1);
    iVar17 = local_494;
    iVar15 = 0;
    if (local_494 == iVar14) {
      iVar14 = uprv_min_63(100,-1);
      iVar15 = 0;
      iVar17 = iVar7;
      if (iVar7 == iVar14) {
        local_494 = 0;
        iVar17 = iVar15;
      }
    }
  }
  input = properties->roundingIncrement;
  local_400.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_400.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar7 = uprv_min_63(100,-1);
  if (iVar12 == iVar7) {
    if ((input == 0.0) && (!NAN(input))) goto LAB_0025f2ad;
    dVar6 = roundingutils::doubleFractionLength(input);
    DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_460);
    DecimalQuantity::setToDouble((DecimalQuantity *)local_460,input);
    DecimalQuantity::adjustMagnitude((DecimalQuantity *)local_460,(int)dVar6);
    DecimalQuantity::roundToMagnitude((DecimalQuantity *)local_460,0,UNUM_FOUND_HALFEVEN,local_3c0);
    DecimalQuantity::toPlainString(&local_3b0,(DecimalQuantity *)local_460);
    uVar18 = local_3b0.fUnion.fFields.fLength;
    if (-1 < local_3b0.fUnion.fStackFields.fLengthAndFlags) {
      uVar18 = (int)local_3b0.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (uVar18 == 0) {
      uVar19 = 0;
      iVar7 = 0;
    }
    else {
      if (((int)local_3b0.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_3b0.fUnion.fFields.fArray = local_3b0.fUnion.fStackFields.fBuffer;
      }
      uVar19 = (uint)(*local_3b0.fUnion.fFields.fArray == L'-');
      iVar7 = uVar18 - uVar19;
    }
    UnicodeString::doAppend(&local_400,&local_3b0,uVar19,iVar7);
    iVar23 = -(int)dVar6;
    UnicodeString::~UnicodeString(&local_3b0);
    DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_460);
  }
  else {
    uVar18 = local_400.fUnion.fFields.fLength;
    if (-1 < local_400.fUnion.fStackFields.fLengthAndFlags) {
      uVar18 = (int)local_400.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if ((int)uVar18 < iVar11) {
      do {
        local_460._0_2_ = L'@';
        UnicodeString::doAppend(&local_400,(UChar *)local_460,0,1);
        uVar18 = local_400.fUnion.fFields.fLength;
        if (-1 < local_400.fUnion.fStackFields.fLengthAndFlags) {
          uVar18 = (int)local_400.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
      } while ((int)uVar18 < iVar11);
    }
    if ((int)uVar18 < iVar12) {
      do {
        local_460._0_2_ = L'#';
        UnicodeString::doAppend(&local_400,(UChar *)local_460,0,1);
        uVar18 = local_400.fUnion.fFields.fLength;
        if (-1 < local_400.fUnion.fStackFields.fLengthAndFlags) {
          uVar18 = (int)local_400.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
      } while ((int)uVar18 < iVar12);
    }
LAB_0025f2ad:
    iVar23 = 0;
  }
  uVar18 = (int)local_400.fUnion.fStackFields.fLengthAndFlags >> 5;
  if (local_400.fUnion.fStackFields.fLengthAndFlags < 0) {
    uVar18 = local_400.fUnion.fFields.fLength;
  }
  if (uVar18 + iVar23 < iVar9) {
    do {
      local_460._0_2_ = L'0';
      UnicodeString::doReplace(&local_400,0,0,(UChar *)local_460,0,1);
      uVar18 = (int)local_400.fUnion.fStackFields.fLengthAndFlags >> 5;
      if (local_400.fUnion.fStackFields.fLengthAndFlags < 0) {
        uVar18 = local_400.fUnion.fFields.fLength;
      }
    } while (uVar18 + iVar23 < iVar9);
  }
  iVar22 = -iVar23;
  y = iVar23;
  if (iVar10 != iVar22 && SBORROW4(iVar10,iVar22) == iVar10 + iVar23 < 0) {
    y = -iVar10;
    iVar21 = iVar22;
    do {
      local_460._0_2_ = L'0';
      UnicodeString::doAppend(&local_400,(UChar *)local_460,0,1);
      iVar21 = iVar21 + 1;
    } while (iVar21 < iVar10);
  }
  uVar18 = (int)local_400.fUnion.fStackFields.fLengthAndFlags >> 5;
  if (local_400.fUnion.fStackFields.fLengthAndFlags < 0) {
    uVar18 = local_400.fUnion.fFields.fLength;
  }
  iVar15 = uprv_max_63(iVar15 + iVar17 + 1,uVar18 + y);
  iVar7 = local_408;
  if (local_404 != 100) {
    iVar15 = uprv_max_63(local_404,iVar15);
  }
  if (iVar7 != 100) {
    y = uprv_min_63(-iVar7,y);
  }
  if (y < iVar15) {
    if (iVar10 < iVar22) {
      iVar22 = iVar10;
    }
    iVar23 = ((iVar23 + iVar22) - iVar15) - iVar10;
    do {
      iVar22 = iVar15 + -1;
      uVar18 = local_400.fUnion.fFields.fLength;
      if (-1 < local_400.fUnion.fStackFields.fLengthAndFlags) {
        uVar18 = (int)local_400.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      uVar19 = uVar18 + iVar23;
      if ((int)uVar19 < 0 || (int)uVar18 <= (int)uVar19) {
        local_460._0_2_ = L'#';
        UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
      }
      else {
        uVar20 = local_400.fUnion.fStackFields.fBuffer;
        if (((int)local_400.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
          uVar20 = local_400.fUnion.fFields.fArray;
        }
        local_460._0_2_ = *(char16_t *)(uVar20 + (ulong)uVar19 * 2);
        UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
      }
      if (((iVar17 < iVar22) && (0 < local_494)) && ((iVar22 - iVar17) % local_494 == 0)) {
        local_460._0_2_ = L',';
        UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
      }
      else if ((iVar15 < 2) || (iVar22 - iVar17 != 0)) {
        if ((iVar22 == 0 & (y < 0 | bVar1)) == 1) {
          local_460._0_2_ = L'.';
          UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
        }
      }
      else {
        local_460._0_2_ = L',';
        UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
      }
      iVar23 = iVar23 + 1;
      iVar15 = iVar22;
    } while (y < iVar22);
  }
  iVar7 = uprv_min_63(100,-1);
  if (iVar13 != iVar7) {
    local_460._0_2_ = L'E';
    UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
    if (bVar2 != false) {
      local_460._0_2_ = L'+';
      UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
    }
    if (0 < iVar13) {
      do {
        local_460._0_2_ = L'0';
        UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
  }
  NVar4 = local_3b8;
  uVar5 = local_410;
  sVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    iVar7 = (__return_storage_ptr__->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar3 >> 5;
  }
  if ((local_2b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < local_2b0.fUnion.fStackFields.fLengthAndFlags) {
      local_2b0.fUnion.fFields.fLength = (int)local_2b0.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(__return_storage_ptr__,&local_2b0,0,local_2b0.fUnion.fFields.fLength);
  }
  AffixUtils::escape((UnicodeString *)local_460,&local_b0);
  iVar17 = local_460._12_4_;
  if (-1 < (short)local_460._8_2_) {
    iVar17 = (int)(short)local_460._8_2_ >> 5;
  }
  UnicodeString::doAppend(__return_storage_ptr__,(UnicodeString *)local_460,0,iVar17);
  UnicodeString::~UnicodeString((UnicodeString *)local_460);
  iVar17 = (int)uVar5;
  if ((iVar8 != -1) && (((ulong)NVar4 & 1) == 0)) {
    sVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
    if (sVar3 < 0) {
      iVar15 = (__return_storage_ptr__->fUnion).fFields.fLength;
    }
    else {
      iVar15 = (int)sVar3 >> 5;
    }
    if (iVar15 < iVar8) {
      do {
        local_460._0_2_ = L'#';
        UnicodeString::doReplace(__return_storage_ptr__,iVar17,0,(UChar *)local_460,0,1);
        sVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
        if (sVar3 < 0) {
          iVar15 = (__return_storage_ptr__->fUnion).fFields.fLength;
        }
        else {
          iVar15 = (int)sVar3 >> 5;
        }
        iVar7 = iVar7 + 1;
      } while (iVar15 < iVar8);
    }
    if (NVar4.fValue < 4) {
      pUVar16 = (UnicodeString *)
                (*(code *)(&DAT_002f7270 + *(int *)(&DAT_002f7270 + ((ulong)NVar4 >> 0x20) * 4)))();
      return pUVar16;
    }
    if (U_ZERO_ERROR < *local_3c0) goto LAB_0025fa20;
  }
  if ((((undefined1)local_1f0[0].fUnion.fStackFields.fLengthAndFlags & 1) != 0) &&
     ((local_230.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) != 0)) {
    if ((local_370.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      uVar18 = local_370.fUnion.fFields.fLength;
      if (-1 < local_370.fUnion.fStackFields.fLengthAndFlags) {
        uVar18 = (int)local_370.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (uVar18 == 1) {
        if ((local_370.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_370.fUnion.fFields.fArray = local_370.fUnion.fStackFields.fBuffer;
        }
        if (*local_370.fUnion.fFields.fArray == L'-') {
          uVar18 = local_330.fUnion.fFields.fLength;
          if (-1 < local_330.fUnion.fStackFields.fLengthAndFlags) {
            uVar18 = (int)local_330.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (uVar18 == 0) goto LAB_0025fa20;
        }
      }
    }
    else if ((local_330.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) goto LAB_0025fa20;
  }
  local_460._0_2_ = L';';
  UnicodeString::doAppend(__return_storage_ptr__,(UChar *)local_460,0,1);
  if ((local_370.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < local_370.fUnion.fStackFields.fLengthAndFlags) {
      local_370.fUnion.fFields.fLength = (int)local_370.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(__return_storage_ptr__,&local_370,0,local_370.fUnion.fFields.fLength);
  }
  AffixUtils::escape((UnicodeString *)local_460,local_1f0);
  if (-1 < (short)local_460._8_2_) {
    local_460._12_4_ = (int)(short)local_460._8_2_ >> 5;
  }
  UnicodeString::doAppend(__return_storage_ptr__,(UnicodeString *)local_460,0,local_460._12_4_);
  UnicodeString::~UnicodeString((UnicodeString *)local_460);
  UnicodeString::UnicodeString((UnicodeString *)local_460,__return_storage_ptr__);
  UnicodeString::doAppend(__return_storage_ptr__,(UnicodeString *)local_460,iVar17,iVar7 - iVar17);
  if ((local_330.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < local_330.fUnion.fStackFields.fLengthAndFlags) {
      local_330.fUnion.fFields.fLength = (int)local_330.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(__return_storage_ptr__,&local_330,0,local_330.fUnion.fFields.fLength);
  }
  AffixUtils::escape(&local_3b0,&local_230);
  if (-1 < local_3b0.fUnion.fStackFields.fLengthAndFlags) {
    local_3b0.fUnion.fFields.fLength = (int)local_3b0.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend(__return_storage_ptr__,&local_3b0,0,local_3b0.fUnion.fFields.fLength);
  UnicodeString::~UnicodeString(&local_3b0);
  UnicodeString::~UnicodeString((UnicodeString *)local_460);
LAB_0025fa20:
  UnicodeString::~UnicodeString(&local_400);
  UnicodeString::~UnicodeString(&local_330);
  UnicodeString::~UnicodeString(&local_230);
  UnicodeString::~UnicodeString(&local_370);
  UnicodeString::~UnicodeString(local_1f0);
  UnicodeString::~UnicodeString(&local_2b0);
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_270);
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::~UnicodeString(&local_2f0);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString PatternStringUtils::propertiesToPatternString(const DecimalFormatProperties& properties,
                                                            UErrorCode& status) {
    UnicodeString sb;

    // Convenience references
    // The uprv_min() calls prevent DoS
    int dosMax = 100;
    int groupingSize = uprv_min(properties.secondaryGroupingSize, dosMax);
    int firstGroupingSize = uprv_min(properties.groupingSize, dosMax);
    int paddingWidth = uprv_min(properties.formatWidth, dosMax);
    NullableValue<PadPosition> paddingLocation = properties.padPosition;
    UnicodeString paddingString = properties.padString;
    int minInt = uprv_max(uprv_min(properties.minimumIntegerDigits, dosMax), 0);
    int maxInt = uprv_min(properties.maximumIntegerDigits, dosMax);
    int minFrac = uprv_max(uprv_min(properties.minimumFractionDigits, dosMax), 0);
    int maxFrac = uprv_min(properties.maximumFractionDigits, dosMax);
    int minSig = uprv_min(properties.minimumSignificantDigits, dosMax);
    int maxSig = uprv_min(properties.maximumSignificantDigits, dosMax);
    bool alwaysShowDecimal = properties.decimalSeparatorAlwaysShown;
    int exponentDigits = uprv_min(properties.minimumExponentDigits, dosMax);
    bool exponentShowPlusSign = properties.exponentSignAlwaysShown;
    UnicodeString pp = properties.positivePrefix;
    UnicodeString ppp = properties.positivePrefixPattern;
    UnicodeString ps = properties.positiveSuffix;
    UnicodeString psp = properties.positiveSuffixPattern;
    UnicodeString np = properties.negativePrefix;
    UnicodeString npp = properties.negativePrefixPattern;
    UnicodeString ns = properties.negativeSuffix;
    UnicodeString nsp = properties.negativeSuffixPattern;

    // Prefixes
    if (!ppp.isBogus()) {
        sb.append(ppp);
    }
    sb.append(AffixUtils::escape(pp));
    int afterPrefixPos = sb.length();

    // Figure out the grouping sizes.
    int grouping1, grouping2, grouping;
    if (groupingSize != uprv_min(dosMax, -1) && firstGroupingSize != uprv_min(dosMax, -1) &&
        groupingSize != firstGroupingSize) {
        grouping = groupingSize;
        grouping1 = groupingSize;
        grouping2 = firstGroupingSize;
    } else if (groupingSize != uprv_min(dosMax, -1)) {
        grouping = groupingSize;
        grouping1 = 0;
        grouping2 = groupingSize;
    } else if (firstGroupingSize != uprv_min(dosMax, -1)) {
        grouping = groupingSize;
        grouping1 = 0;
        grouping2 = firstGroupingSize;
    } else {
        grouping = 0;
        grouping1 = 0;
        grouping2 = 0;
    }
    int groupingLength = grouping1 + grouping2 + 1;

    // Figure out the digits we need to put in the pattern.
    double roundingInterval = properties.roundingIncrement;
    UnicodeString digitsString;
    int digitsStringScale = 0;
    if (maxSig != uprv_min(dosMax, -1)) {
        // Significant Digits.
        while (digitsString.length() < minSig) {
            digitsString.append(u'@');
        }
        while (digitsString.length() < maxSig) {
            digitsString.append(u'#');
        }
    } else if (roundingInterval != 0.0) {
        // Rounding Interval.
        digitsStringScale = -roundingutils::doubleFractionLength(roundingInterval);
        // TODO: Check for DoS here?
        DecimalQuantity incrementQuantity;
        incrementQuantity.setToDouble(roundingInterval);
        incrementQuantity.adjustMagnitude(-digitsStringScale);
        incrementQuantity.roundToMagnitude(0, kDefaultMode, status);
        UnicodeString str = incrementQuantity.toPlainString();
        if (str.charAt(0) == u'-') {
            // TODO: Unsupported operation exception or fail silently?
            digitsString.append(str, 1, str.length() - 1);
        } else {
            digitsString.append(str);
        }
    }
    while (digitsString.length() + digitsStringScale < minInt) {
        digitsString.insert(0, u'0');
    }
    while (-digitsStringScale < minFrac) {
        digitsString.append(u'0');
        digitsStringScale--;
    }

    // Write the digits to the string builder
    int m0 = uprv_max(groupingLength, digitsString.length() + digitsStringScale);
    m0 = (maxInt != dosMax) ? uprv_max(maxInt, m0) - 1 : m0 - 1;
    int mN = (maxFrac != dosMax) ? uprv_min(-maxFrac, digitsStringScale) : digitsStringScale;
    for (int magnitude = m0; magnitude >= mN; magnitude--) {
        int di = digitsString.length() + digitsStringScale - magnitude - 1;
        if (di < 0 || di >= digitsString.length()) {
            sb.append(u'#');
        } else {
            sb.append(digitsString.charAt(di));
        }
        if (magnitude > grouping2 && grouping > 0 && (magnitude - grouping2) % grouping == 0) {
            sb.append(u',');
        } else if (magnitude > 0 && magnitude == grouping2) {
            sb.append(u',');
        } else if (magnitude == 0 && (alwaysShowDecimal || mN < 0)) {
            sb.append(u'.');
        }
    }

    // Exponential notation
    if (exponentDigits != uprv_min(dosMax, -1)) {
        sb.append(u'E');
        if (exponentShowPlusSign) {
            sb.append(u'+');
        }
        for (int i = 0; i < exponentDigits; i++) {
            sb.append(u'0');
        }
    }

    // Suffixes
    int beforeSuffixPos = sb.length();
    if (!psp.isBogus()) {
        sb.append(psp);
    }
    sb.append(AffixUtils::escape(ps));

    // Resolve Padding
    if (paddingWidth != -1 && !paddingLocation.isNull()) {
        while (paddingWidth - sb.length() > 0) {
            sb.insert(afterPrefixPos, u'#');
            beforeSuffixPos++;
        }
        int addedLength;
        switch (paddingLocation.get(status)) {
            case PadPosition::UNUM_PAD_BEFORE_PREFIX:
                addedLength = escapePaddingString(paddingString, sb, 0, status);
                sb.insert(0, u'*');
                afterPrefixPos += addedLength + 1;
                beforeSuffixPos += addedLength + 1;
                break;
            case PadPosition::UNUM_PAD_AFTER_PREFIX:
                addedLength = escapePaddingString(paddingString, sb, afterPrefixPos, status);
                sb.insert(afterPrefixPos, u'*');
                afterPrefixPos += addedLength + 1;
                beforeSuffixPos += addedLength + 1;
                break;
            case PadPosition::UNUM_PAD_BEFORE_SUFFIX:
                escapePaddingString(paddingString, sb, beforeSuffixPos, status);
                sb.insert(beforeSuffixPos, u'*');
                break;
            case PadPosition::UNUM_PAD_AFTER_SUFFIX:
                sb.append(u'*');
                escapePaddingString(paddingString, sb, sb.length(), status);
                break;
        }
        if (U_FAILURE(status)) { return sb; }
    }

    // Negative affixes
    // Ignore if the negative prefix pattern is "-" and the negative suffix is empty
    if (!np.isBogus() || !ns.isBogus() || (npp.isBogus() && !nsp.isBogus()) ||
        (!npp.isBogus() && (npp.length() != 1 || npp.charAt(0) != u'-' || nsp.length() != 0))) {
        sb.append(u';');
        if (!npp.isBogus()) {
            sb.append(npp);
        }
        sb.append(AffixUtils::escape(np));
        // Copy the positive digit format into the negative.
        // This is optional; the pattern is the same as if '#' were appended here instead.
        // NOTE: It is not safe to append the UnicodeString to itself, so we need to copy.
        // See http://bugs.icu-project.org/trac/ticket/13707
        UnicodeString copy(sb);
        sb.append(copy, afterPrefixPos, beforeSuffixPos - afterPrefixPos);
        if (!nsp.isBogus()) {
            sb.append(nsp);
        }
        sb.append(AffixUtils::escape(ns));
    }

    return sb;
}